

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpAcceptor.h
# Opt level: O3

void __thiscall gmlc::networking::TcpAcceptor::~TcpAcceptor(TcpAcceptor *this)

{
  _Atomic_word *p_Var1;
  _Manager_type p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  int iVar4;
  int in_ESI;
  
  close(this,in_ESI);
  std::condition_variable::~condition_variable(&(this->accepting).cv_active);
  std::condition_variable::~condition_variable(&(this->accepting).cv_trigger);
  p_Var2 = (this->logFunction).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->logFunction,(_Any_data *)&this->logFunction,__destroy_functor);
  }
  p_Var2 = (this->errorCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->errorCall,(_Any_data *)&this->errorCall,__destroy_functor);
  }
  p_Var2 = (this->acceptCall).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    (*p_Var2)((_Any_data *)&this->acceptCall,(_Any_data *)&this->acceptCall,__destroy_functor);
  }
  asio::detail::
  io_object_impl<asio::detail::reactive_socket_service<asio::ip::tcp>,_asio::any_io_executor>::
  ~io_object_impl(&(this->acceptor_).impl_);
  p_Var3 = (this->super_enable_shared_from_this<gmlc::networking::TcpAcceptor>)._M_weak_this.
           super___weak_ptr<gmlc::networking::TcpAcceptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var3->_M_weak_count;
      iVar4 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar4 = p_Var3->_M_weak_count;
      p_Var3->_M_weak_count = iVar4 + -1;
    }
    if (iVar4 == 1) {
      (*p_Var3->_vptr__Sp_counted_base[3])();
      return;
    }
  }
  return;
}

Assistant:

~TcpAcceptor()
    {
        try {
            close();
        }
        catch (...) {
        }
    }